

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::
~WrappableStreamMixin(WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> *this)

{
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> local_58 [3];
  String local_40;
  bool local_21;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *pMStack_20;
  bool _kj_shouldLog;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *w;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *_w1299;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> *this_local;
  
  _w1299 = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)this;
  pMStack_20 = kj::_::readMaybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>>
                         (&this->currentWrapper);
  if (pMStack_20 != (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
    w = pMStack_20;
    local_21 = kj::_::Debug::shouldLog(ERROR);
    while (local_21 != false) {
      getStackTrace();
      kj::_::Debug::log<char_const(&)[62],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x515,ERROR,
                 "\"HTTP connection destroyed while HTTP body streams still exist\", kj::getStackTrace()"
                 ,(char (*) [62])"HTTP connection destroyed while HTTP body streams still exist",
                 &local_40);
      String::~String(&local_40);
      local_21 = false;
    }
    Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>::Maybe(local_58);
    Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>::operator=(pMStack_20,local_58);
  }
  return;
}

Assistant:

~WrappableStreamMixin() noexcept(false) {
    KJ_IF_SOME(w, currentWrapper) {
      KJ_LOG(ERROR, "HTTP connection destroyed while HTTP body streams still exist",
          kj::getStackTrace());
      w = kj::none;
    }
  }